

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O2

void * Inta_ManInterpolate(Inta_Man_t *p,Sto_Man_t *pCnf,abctime TimeToStop,void *vVarsAB,
                          int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  Aig_Man_t *p_00;
  FILE *pFVar7;
  int level;
  Sto_Man_t *p_01;
  uint uVar8;
  Sto_Cls_t *pSVar9;
  
  aVar5 = Abc_Clock();
  if ((TimeToStop != 0) && (aVar6 = Abc_Clock(), TimeToStop < aVar6)) {
    return (void *)0x0;
  }
  if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
    __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x3bc,
                  "void *Inta_ManInterpolate(Inta_Man_t *, Sto_Man_t *, abctime, void *, int)");
  }
  p->pCnf = pCnf;
  p->fVerbose = fVerbose;
  p->vVarsAB = (Vec_Int_t *)vVarsAB;
  p_00 = Aig_ManStart(10000);
  p->pAig = p_00;
  Aig_IthVar(p_00,p->vVarsAB->nSize + -1);
  Inta_ManResize(p);
  Inta_ManPrepareInter(p);
  if (p->fProofWrite != 0) {
    pFVar7 = fopen("proof.cnf_","w");
    p->pFile = (FILE *)pFVar7;
    p->Counter = 0;
  }
  pSVar9 = (Sto_Cls_t *)&p->pCnf->pHead;
  do {
    pSVar9 = pSVar9->pNext;
    if ((pSVar9 == (Sto_Cls_t *)0x0) || ((pSVar9->field_0x1c & 2) == 0)) {
      iVar4 = Inta_ManProcessRoots(p);
      if (iVar4 == 0) goto LAB_0070fb8e;
      pSVar9 = (Sto_Cls_t *)&p->pCnf->pHead;
      goto LAB_0070fb50;
    }
    Inta_ManProofWriteOne(p,pSVar9);
  } while ((TimeToStop == 0) || (aVar6 = Abc_Clock(), aVar6 <= TimeToStop));
  goto LAB_0070fb7e;
LAB_0070fb8e:
  if (p->fProofWrite != 0) {
    fclose((FILE *)p->pFile);
    p->pFile = (FILE *)0x0;
  }
  p_01 = p->pCnf;
  if (fVerbose != 0) {
    uVar1 = p_01->nVars;
    uVar2 = p_01->nRoots;
    uVar3 = p->Counter;
    uVar8 = p_01->nClauses - uVar2;
    iVar4 = Sto_ManMemoryReport(p_01);
    level = 0x88a95e;
    printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB  ",
           (double)(int)(uVar3 - uVar2) / (double)(int)uVar8,(double)iVar4 * 9.5367431640625e-07,
           (ulong)uVar1,(ulong)uVar2,(ulong)uVar8,(ulong)uVar3);
    aVar6 = Abc_Clock();
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(aVar6 - aVar5) / 1000000.0);
    aVar6 = Abc_Clock();
    p->timeTotal = p->timeTotal + (aVar6 - aVar5);
    p_01 = p->pCnf;
  }
  Aig_ObjCreateCo(p_00,p->pInters[p_01->pTail->Id]);
  Aig_ManCleanup(p_00);
  goto LAB_0070fc84;
  while( true ) {
    iVar4 = Inta_ManProofRecordOne(p,pSVar9);
    if (iVar4 == 0) goto LAB_0070fb8e;
    if ((TimeToStop != 0) && (aVar6 = Abc_Clock(), TimeToStop < aVar6)) break;
LAB_0070fb50:
    do {
      pSVar9 = pSVar9->pNext;
      if (pSVar9 == (Sto_Cls_t *)0x0) goto LAB_0070fb8e;
    } while ((pSVar9->field_0x1c & 2) != 0);
  }
LAB_0070fb7e:
  Aig_ManStop(p_00);
  p_00 = (Aig_Man_t *)0x0;
LAB_0070fc84:
  p->pAig = (Aig_Man_t *)0x0;
  return p_00;
}

Assistant:

void * Inta_ManInterpolate( Inta_Man_t * p, Sto_Man_t * pCnf, abctime TimeToStop, void * vVarsAB, int fVerbose )
{
    Aig_Man_t * pRes;
    Aig_Obj_t * pObj;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    if ( TimeToStop && Abc_Clock() > TimeToStop )
        return NULL;

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;
    p->vVarsAB = (Vec_Int_t *)vVarsAB;
    p->pAig = pRes = Aig_ManStart( 10000 );
    Aig_IthVar( p->pAig, Vec_IntSize(p->vVarsAB) - 1 );

    // adjust the manager
    Inta_ManResize( p );

    // prepare the interpolant computation
    Inta_ManPrepareInter( p );

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        Inta_ManProofWriteOne( p, pClause );
        if ( TimeToStop && Abc_Clock() > TimeToStop )
        {
            Aig_ManStop( pRes );
            p->pAig = NULL;
            return NULL;
        }
    }

    // propagate root level assignments
    if ( Inta_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Inta_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
            if ( TimeToStop && Abc_Clock() > TimeToStop )
            {
                Aig_ManStop( pRes );
                p->pAig = NULL;
                return NULL;
            }
        }
    }

    // stop the proof
    if ( p->fProofWrite )
    { 
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Interpo", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB  ", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    pObj = *Inta_ManAigRead( p, p->pCnf->pTail );
    Aig_ObjCreateCo( pRes, pObj );
    Aig_ManCleanup( pRes );

    p->pAig = NULL;
    return pRes;
    
}